

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O3

void Abc_NtkMarkCone_rec(Abc_Obj_t *pObj,int fForward)

{
  long lVar1;
  
  if ((*(uint *)&pObj->field_0x14 & 0x10) == 0) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x10;
    if (fForward == 0) {
      if (0 < (pObj->vFanins).nSize) {
        lVar1 = 0;
        do {
          Abc_NtkMarkCone_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar1]],
                              0);
          lVar1 = lVar1 + 1;
        } while (lVar1 < (pObj->vFanins).nSize);
      }
    }
    else if (0 < (pObj->vFanouts).nSize) {
      lVar1 = 0;
      do {
        Abc_NtkMarkCone_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar1]],
                            fForward);
        lVar1 = lVar1 + 1;
      } while (lVar1 < (pObj->vFanouts).nSize);
    }
  }
  return;
}

Assistant:

void Abc_NtkMarkCone_rec( Abc_Obj_t * pObj, int fForward )
{
    Abc_Obj_t * pNext;
    int i;
    if ( pObj->fMarkA )
        return;
    pObj->fMarkA = 1;
    if ( fForward )
    {
        Abc_ObjForEachFanout( pObj, pNext, i )
            Abc_NtkMarkCone_rec( pNext, fForward );
    }
    else
    {
        Abc_ObjForEachFanin( pObj, pNext, i )
            Abc_NtkMarkCone_rec( pNext, fForward );
    }
}